

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::prepareForNSolve(MLMG *this)

{
  MFInfo *__args_4;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *puVar1;
  unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *val;
  pointer this_00;
  pointer pMVar2;
  pointer pMVar3;
  int *in_RDI;
  int ng;
  DistributionMapping *dm;
  BoxArray *ba;
  int nghost;
  int ncomp;
  unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *in_stack_ffffffffffffff08;
  MLLinOp *in_stack_ffffffffffffff10;
  MFInfo *this_01;
  MLLinOp *__args;
  int *__args_3;
  DistributionMapping *in_stack_ffffffffffffff50;
  BoxArray *in_stack_ffffffffffffff58;
  BoxArray *__args_00;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffff70;
  FabFactory<amrex::FArrayBox> *__args_5;
  pointer local_68;
  pointer piStack_60;
  pointer local_58;
  pointer piStack_50;
  pointer local_48;
  bool local_2c;
  bool bStack_2b;
  bool bStack_2a;
  undefined1 uStack_29;
  MFInfo *local_28;
  BoxArray *local_20;
  bool local_18;
  bool bStack_17;
  bool bStack_16;
  undefined1 uStack_15;
  undefined4 local_14;
  
  (**(code **)(**(long **)(in_RDI + 0x12) + 0x108))
            (&stack0xfffffffffffffff0,*(long **)(in_RDI + 0x12),in_RDI[0x1b]);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator=
            ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::~unique_ptr
            ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)
             in_stack_ffffffffffffff10);
  local_14 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x28))();
  local_18 = false;
  bStack_17 = false;
  bStack_16 = false;
  uStack_15 = 0;
  if (in_RDI[9] == 1) {
    _local_18 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x30))(*(long **)(in_RDI + 0x12),0);
  }
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator*
            ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)
             in_stack_ffffffffffffff10);
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                *)in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  local_20 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator*
            ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)
             in_stack_ffffffffffffff10);
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                *)in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  __args_4 = (MFInfo *)
             Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
             operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         *)in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  local_2c = true;
  bStack_2b = false;
  bStack_2a = false;
  uStack_29 = 0;
  if (in_RDI[9] == 1) {
    local_2c = local_18;
    bStack_2b = bStack_17;
    bStack_2a = bStack_16;
    uStack_29 = uStack_15;
  }
  local_58 = (pointer)0x0;
  piStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  piStack_60 = (pointer)0x0;
  local_48 = (pointer)0x0;
  __args_3 = (int *)&stack0xffffffffffffff98;
  local_28 = __args_4;
  MFInfo::MFInfo((MFInfo *)0x125cbeb);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator->
            ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)0x125cbf9);
  puVar1 = (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
           MLLinOp::Factory(in_stack_ffffffffffffff10,
                            (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                            (int)in_stack_ffffffffffffff08);
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int_const&,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_RDI,__args_3,__args_4,
             in_stack_ffffffffffffff70);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_ffffffffffffff10,puVar1);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_ffffffffffffff10);
  MFInfo::~MFInfo((MFInfo *)0x125cc6f);
  local_2c = false;
  bStack_2b = false;
  bStack_2a = false;
  uStack_29 = 0;
  if (in_RDI[9] == 1) {
    local_2c = local_18;
    bStack_2b = bStack_17;
    bStack_2a = bStack_16;
    uStack_29 = uStack_15;
  }
  __args_5 = (FabFactory<amrex::FArrayBox> *)0x0;
  __args_00 = (BoxArray *)0x0;
  __args = (MLLinOp *)&stack0xffffffffffffff58;
  this_01 = local_28;
  MFInfo::MFInfo((MFInfo *)0x125ccfa);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator->
            ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)0x125cd08);
  val = (unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)
        MLLinOp::Factory(in_stack_ffffffffffffff10,(int)((ulong)puVar1 >> 0x20),(int)puVar1);
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int_const&,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
            (__args_00,in_stack_ffffffffffffff50,in_RDI,__args_3,__args_4,__args_5);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_ffffffffffffff10,
             (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)val);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_ffffffffffffff10);
  MFInfo::~MFInfo((MFInfo *)0x125cd72);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x125cd83);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffff10,(value_type)val);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x125cd9f);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffff10,(value_type)val);
  this_00 = std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator->
                      ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)0x125cdb8
                      );
  pMVar2 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                     ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_00)
  ;
  (*this_00->_vptr_MLLinOp[3])(this_00,0,pMVar2,0,0);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator*
            ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)this_00);
  std::make_unique<amrex::MLMG,amrex::MLLinOp&>(__args);
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::operator=
            ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)this_00,val);
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::~unique_ptr
            ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)this_01);
  pMVar3 = std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::operator->
                     ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)0x125ce2f);
  setVerbose(pMVar3,0);
  pMVar3 = std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::operator->
                     ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)0x125ce47);
  setFixedIter(pMVar3,1);
  pMVar3 = std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::operator->
                     ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)0x125ce62);
  setMaxFmgIter(pMVar3,0x14);
  pMVar3 = std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::operator->
                     ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)0x125ce7d);
  setBottomSolver(pMVar3,smoother);
  return;
}

Assistant:

void
MLMG::prepareForNSolve ()
{
    ns_linop = linop.makeNLinOp(nsolve_grid_size);

    const int ncomp = linop.getNComp();
    int nghost = 0;
    if (cf_strategy == CFStrategy::ghostnodes) nghost = linop.getNGrow();

    const BoxArray& ba = (*ns_linop).m_grids[0][0];
    const DistributionMapping& dm =(*ns_linop).m_dmap[0][0];

    int ng = 1;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_sol = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ng = 0;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_rhs = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ns_sol->setVal(0.0);
    ns_rhs->setVal(0.0);

    ns_linop->setLevelBC(0, ns_sol.get());

    ns_mlmg = std::make_unique<MLMG>(*ns_linop);
    ns_mlmg->setVerbose(0);
    ns_mlmg->setFixedIter(1);
    ns_mlmg->setMaxFmgIter(20);
    ns_mlmg->setBottomSolver(BottomSolver::smoother);
}